

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simple_polygon_mesh.cpp
# Opt level: O2

string * __thiscall
geometrycentral::surface::SimplePolygonMesh::detectFileType
          (string *__return_storage_ptr__,SimplePolygonMesh *this,string *filename)

{
  _Alloc_hider _Var1;
  size_type sVar2;
  int iVar3;
  long lVar4;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  _Var5;
  runtime_error *prVar6;
  size_type sVar7;
  string extension;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  lVar4 = ::std::__cxx11::string::rfind((char)filename,0x2e);
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  if (lVar4 == -1) {
    prVar6 = (runtime_error *)__cxa_allocate_exception(0x10);
    ::std::operator+(&extension,"Could not auto-detect file type to load mesh from ",filename);
    ::std::runtime_error::runtime_error(prVar6,(string *)&extension);
    __cxa_throw(prVar6,&::std::runtime_error::typeinfo,::std::runtime_error::~runtime_error);
  }
  extension._M_dataplus._M_p = (pointer)&extension.field_2;
  extension._M_string_length = 0;
  extension.field_2._M_local_buf[0] = '\0';
  ::std::__cxx11::string::substr((ulong)&local_90,(ulong)filename);
  ::std::__cxx11::string::operator=((string *)&extension,(string *)&local_90);
  ::std::__cxx11::string::~string((string *)&local_90);
  sVar2 = extension._M_string_length;
  _Var1 = extension._M_dataplus;
  for (sVar7 = 0; sVar2 != sVar7; sVar7 = sVar7 + 1) {
    iVar3 = tolower((int)_Var1._M_p[sVar7]);
    _Var1._M_p[sVar7] = (char)iVar3;
  }
  ::std::__cxx11::string::_M_assign((string *)__return_storage_ptr__);
  ::std::__cxx11::string::~string((string *)&extension);
  _Var5 = ::std::
          __find_if<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,__gnu_cxx::__ops::_Iter_equals_val<std::__cxx11::string_const>>
                    ((anonymous_namespace)::supportedMeshTypes_abi_cxx11_,DAT_00480b08,
                     __return_storage_ptr__);
  if (_Var5._M_current != DAT_00480b08) {
    return __return_storage_ptr__;
  }
  prVar6 = (runtime_error *)__cxa_allocate_exception(0x10);
  ::std::operator+(&local_70,"Detected file type ",__return_storage_ptr__);
  ::std::operator+(&local_50,&local_70," to load mesh from ");
  ::std::operator+(&local_90,&local_50,filename);
  ::std::operator+(&extension,&local_90,". This is not a supported file type.");
  ::std::runtime_error::runtime_error(prVar6,(string *)&extension);
  __cxa_throw(prVar6,&::std::runtime_error::typeinfo,::std::runtime_error::~runtime_error);
}

Assistant:

std::string SimplePolygonMesh::detectFileType(std::string filename) {
  std::string::size_type sepInd = filename.rfind('.');
  std::string type;

  if (sepInd != std::string::npos) {
    std::string extension;
    extension = filename.substr(sepInd + 1);

    // Convert to all lowercase
    std::transform(extension.begin(), extension.end(), extension.begin(), ::tolower);
    type = extension;
  } else {
    throw std::runtime_error("Could not auto-detect file type to load mesh from " + filename);
  }

  // Check if this is one of the filetypes we're aware of
  if (std::find(std::begin(supportedMeshTypes), std::end(supportedMeshTypes), type) == std::end(supportedMeshTypes)) {
    throw std::runtime_error("Detected file type " + type + " to load mesh from " + filename +
                             ". This is not a supported file type.");
  }

  return type;
}